

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpf_dump.c
# Opt level: O0

void bpf_dump(bpf_program *p,int option)

{
  uint uVar1;
  char *__s;
  int local_24;
  int n;
  int i;
  bpf_insn *insn;
  int option_local;
  bpf_program *p_local;
  
  uVar1 = p->bf_len;
  _n = p->bf_insns;
  if (option < 3) {
    if (option < 2) {
      for (local_24 = 0; local_24 < (int)uVar1; local_24 = local_24 + 1) {
        __s = bpf_image(_n,local_24);
        puts(__s);
        _n = _n + 1;
      }
    }
    else {
      for (local_24 = 0; local_24 < (int)uVar1; local_24 = local_24 + 1) {
        printf("{ 0x%x, %d, %d, 0x%08x },\n",(ulong)_n->code,(ulong)_n->jt,(ulong)_n->jf,
               (ulong)_n->k);
        _n = _n + 1;
      }
    }
  }
  else {
    printf("%d\n",(ulong)uVar1);
    for (local_24 = 0; local_24 < (int)uVar1; local_24 = local_24 + 1) {
      printf("%u %u %u %u\n",(ulong)_n->code,(ulong)_n->jt,(ulong)_n->jf,(ulong)_n->k);
      _n = _n + 1;
    }
  }
  return;
}

Assistant:

void
bpf_dump(const struct bpf_program *p, int option)
{
	const struct bpf_insn *insn;
	int i;
	int n = p->bf_len;

	insn = p->bf_insns;
	if (option > 2) {
		printf("%d\n", n);
		for (i = 0; i < n; ++insn, ++i) {
			printf("%u %u %u %u\n", insn->code,
			       insn->jt, insn->jf, insn->k);
		}
		return ;
	}
	if (option > 1) {
		for (i = 0; i < n; ++insn, ++i)
			printf("{ 0x%x, %d, %d, 0x%08x },\n",
			       insn->code, insn->jt, insn->jf, insn->k);
		return;
	}
	for (i = 0; i < n; ++insn, ++i) {
#ifdef BDEBUG
		extern int bids[];
		if (bids[i] > 0)
			printf("[%02d]", bids[i] - 1);
		else
			printf(" -- ");
#endif
		puts(bpf_image(insn, i));
	}
}